

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_float_rsqrt2_ps_mipsel(CPUMIPSState_conflict4 *env,uint64_t fdt0,uint64_t fdt2)

{
  float_status *s;
  byte bVar1;
  uint uVar2;
  float32 fVar3;
  float32 fVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar3 = float32_mul_mipsel((float32)fdt0,(float32)fdt2,s);
  fVar4 = float32_mul_mipsel((float32)(fdt0 >> 0x20),(float32)(fdt2 >> 0x20),s);
  fVar3 = float32_sub_mipsel(fVar3,0x3f800000,s);
  fVar4 = float32_sub_mipsel(fVar4,0x3f800000,s);
  fVar3 = float32_div_mipsel(fVar3,0x40000000,s);
  fVar4 = float32_div_mipsel(fVar4,0x40000000,s);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar2 = (env->active_fpu).fcr31;
  uVar6 = uVar5 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar6;
  if (uVar5 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar2 >> 7 & uVar5) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar6 | uVar5 << 2;
  }
  return CONCAT44(fVar4,fVar3) ^ 0x8000000080000000;
}

Assistant:

uint64_t helper_float_rsqrt2_ps(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt2)
{
    uint32_t fst0 = fdt0 & 0XFFFFFFFF;
    uint32_t fsth0 = fdt0 >> 32;
    uint32_t fst2 = fdt2 & 0XFFFFFFFF;
    uint32_t fsth2 = fdt2 >> 32;

    fst2 = float32_mul(fst0, fst2, &env->active_fpu.fp_status);
    fsth2 = float32_mul(fsth0, fsth2, &env->active_fpu.fp_status);
    fst2 = float32_sub(fst2, float32_one, &env->active_fpu.fp_status);
    fsth2 = float32_sub(fsth2, float32_one, &env->active_fpu.fp_status);
    fst2 = float32_chs(float32_div(fst2, FLOAT_TWO32,
                                       &env->active_fpu.fp_status));
    fsth2 = float32_chs(float32_div(fsth2, FLOAT_TWO32,
                                       &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}